

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

RGBSpectrum *
pbrt::HairBxDF::SigmaAFromConcentration(RGBSpectrum *__return_storage_ptr__,Float ce,Float cp)

{
  undefined1 auVar1 [16];
  RGB local_18;
  
  auVar1._0_4_ = ce * 0.419 + cp * 0.187;
  auVar1._4_4_ = ce * 0.697 + cp * 0.4;
  auVar1._8_4_ = ce * 0.0 + cp * 0.0;
  auVar1._12_4_ = ce * 0.0 + cp * 0.0;
  local_18.b = ce * 1.37 + cp * 1.05;
  local_18._0_8_ = vmovlps_avx(auVar1);
  RGBSpectrum::RGBSpectrum(__return_storage_ptr__,RGBColorSpace::sRGB,&local_18);
  return __return_storage_ptr__;
}

Assistant:

RGBSpectrum HairBxDF::SigmaAFromConcentration(Float ce, Float cp) {
    RGB eumelaninSigmaA(0.419f, 0.697f, 1.37f);
    RGB pheomelaninSigmaA(0.187f, 0.4f, 1.05f);
    RGB sigma_a = ce * eumelaninSigmaA + cp * pheomelaninSigmaA;
#ifdef PBRT_IS_GPU_CODE
    return RGBSpectrum(*RGBColorSpace_sRGB, sigma_a);
#else
    return RGBSpectrum(*RGBColorSpace::sRGB, sigma_a);
#endif
}